

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_BOOL OVar2;
  OPJ_BYTE *pOVar3;
  OPJ_SIZE_T OVar4;
  OPJ_BYTE *new_header_tile_data;
  OPJ_BYTE *l_current_data;
  OPJ_UINT32 l_remaining_size;
  OPJ_UINT32 l_code_size;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  l_tcp = (opj_tcp_t *)0x0;
  _l_remaining_size = (opj_tcp_t *)0x0;
  l_cp = (opj_cp_t *)p_manager;
  p_manager_local = (opj_event_mgr_t *)p_stream;
  p_stream_local = (opj_stream_private_t *)p_j2k;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xa02,
                  "OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager != (opj_event_mgr_t *)0x0) {
    if (p_stream == (opj_stream_private_t *)0x0) {
      __assert_fail("p_stream != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0xa04,
                    "OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                   );
    }
    l_tcp = (opj_tcp_t *)&p_j2k->m_cp;
    _l_remaining_size = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    OVar1 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,0);
    l_current_data._0_4_ = OVar1 + 9;
    l_current_data._4_4_ = (uint)l_current_data;
    if (*(uint *)&p_stream_local->m_opj_skip < (uint)l_current_data) {
      pOVar3 = (OPJ_BYTE *)opj_realloc(p_stream_local->m_current_data,(ulong)(uint)l_current_data);
      if (pOVar3 == (OPJ_BYTE *)0x0) {
        opj_free(p_stream_local->m_current_data);
        p_stream_local->m_current_data = (OPJ_BYTE *)0x0;
        *(undefined4 *)&p_stream_local->m_opj_skip = 0;
        opj_event_msg((opj_event_mgr_t *)l_cp,1,"Not enough memory to write COD marker\n");
        return 0;
      }
      p_stream_local->m_current_data = pOVar3;
      *(uint *)&p_stream_local->m_opj_skip = l_current_data._4_4_;
    }
    pOVar3 = p_stream_local->m_current_data;
    opj_write_bytes_LE(pOVar3,0xff52,2);
    opj_write_bytes_LE(pOVar3 + 2,l_current_data._4_4_ - 2,2);
    opj_write_bytes_LE(pOVar3 + 4,_l_remaining_size->csty,1);
    opj_write_bytes_LE(pOVar3 + 5,_l_remaining_size->prg,1);
    opj_write_bytes_LE(pOVar3 + 6,_l_remaining_size->numlayers,2);
    opj_write_bytes_LE(pOVar3 + 8,_l_remaining_size->mct,1);
    l_current_data._0_4_ = (uint)l_current_data - 9;
    OVar2 = opj_j2k_write_SPCod_SPCoc
                      ((opj_j2k_t *)p_stream_local,*(OPJ_UINT32 *)&p_stream_local[2].m_seek_fn,0,
                       pOVar3 + 9,(OPJ_UINT32 *)&l_current_data,(opj_event_mgr *)l_cp);
    if (OVar2 == 0) {
      opj_event_msg((opj_event_mgr_t *)l_cp,1,"Error writing COD marker\n");
      p_j2k_local._4_4_ = 0;
    }
    else if ((uint)l_current_data == 0) {
      OVar4 = opj_stream_write_data
                        ((opj_stream_private_t *)p_manager_local,p_stream_local->m_current_data,
                         (ulong)l_current_data._4_4_,(opj_event_mgr_t *)l_cp);
      if (OVar4 == l_current_data._4_4_) {
        p_j2k_local._4_4_ = 1;
      }
      else {
        p_j2k_local._4_4_ = 0;
      }
    }
    else {
      opj_event_msg((opj_event_mgr_t *)l_cp,1,"Error writing COD marker\n");
      p_j2k_local._4_4_ = 0;
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_manager != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                ,0xa03,
                "OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager)
{
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_code_size, l_remaining_size;
    OPJ_BYTE * l_current_data = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = &l_cp->tcps[p_j2k->m_current_tile_number];
    l_code_size = 9 + opj_j2k_get_SPCod_SPCoc_size(p_j2k,
                  p_j2k->m_current_tile_number, 0);
    l_remaining_size = l_code_size;

    if (l_code_size > p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {
        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_code_size);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to write COD marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_code_size;
    }

    l_current_data = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    opj_write_bytes(l_current_data, J2K_MS_COD, 2);           /* COD */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_code_size - 2, 2);      /* L_COD */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_tcp->csty, 1);          /* Scod */
    ++l_current_data;

    opj_write_bytes(l_current_data, (OPJ_UINT32)l_tcp->prg, 1); /* SGcod (A) */
    ++l_current_data;

    opj_write_bytes(l_current_data, l_tcp->numlayers, 2);     /* SGcod (B) */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_tcp->mct, 1);           /* SGcod (C) */
    ++l_current_data;

    l_remaining_size -= 9;

    if (! opj_j2k_write_SPCod_SPCoc(p_j2k, p_j2k->m_current_tile_number, 0,
                                    l_current_data, &l_remaining_size, p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing COD marker\n");
        return OPJ_FALSE;
    }

    if (l_remaining_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing COD marker\n");
        return OPJ_FALSE;
    }

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_code_size,
                              p_manager) != l_code_size) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}